

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O3

void __thiscall QDuplicateTracker<QString,_32UL>::clear(QDuplicateTracker<QString,_32UL> *this)

{
  long in_FS_OFFSET;
  allocator_type local_80;
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_78;
  key_equal local_29;
  QHasher<QString> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_rehash_policy._M_max_load_factor = 0.0;
  local_78._M_rehash_policy._4_4_ = 0;
  local_78.
  super__Hashtable_base<QString,_QString,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<QString,_QString,_std::__detail::_Identity,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_false>._M_tp.
  storedSeed = (_Hash_code_base<QString,_QString,_std::__detail::_Identity,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                )QHashSeed::globalSeed();
  local_78.
  super__Hashtable_alloc<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
  .
  super__Hashtable_ebo_helper<0,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>,_false>
  ._M_tp._M_resource =
       (_Hashtable_ebo_helper<0,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>,_false>
        )std::pmr::get_default_resource();
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  local_78._M_buckets = &local_78._M_single_bucket;
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_move_assign(&(this->set)._M_h,&local_78);
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_78);
  std::pmr::monotonic_buffer_resource::release(&this->res);
  local_80._M_resource = (memory_resource *)&this->res;
  local_28.storedSeed = (size_t)QHashSeed::globalSeed();
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&local_78,0x20,&local_28,&local_29,&local_80);
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_move_assign(&(this->set)._M_h,&local_78);
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear()
    {
#ifdef __cpp_lib_memory_resource
        // The birth defect of std::unordered_set is that both the nodes as
        // well as the bucket array are allocated from the same allocator, so
        // if we want to reclaim memory from the freed nodes, we also need to
        // reclaim the memory for the bucket array.

        set = Set();    // release all memory in `res` (clear() doesn't, and swap() is UB!)
        res.release();  // restore to initial state (buffer, sizeof buffer)
                        // m_b_r can't reuse buffers, anyway
        // now that `res` is reset to the initial state, also reset `set`:
        set = Set{Prealloc, &res};
#else
        set.clear();
#endif // __cpp_lib_memory_resource
    }